

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_write.c
# Opt level: O2

void flash(void)

{
  byte bVar1;
  long lVar2;
  byte i;
  
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    if ((vidpal[lVar2] & 8) != 0) {
      bVar1 = ~vidpal[lVar2] & 7;
      i = bVar1 ^ 7;
      if ((vid_con_reg & 1) != 0) {
        i = bVar1;
      }
      setpalette((ubyte)lVar2,i);
    }
  }
  return;
}

Assistant:

void flash(void) {  // flash function, alternates the flash colours
    ubyte c;         // depending on the video ULA control register
    ubyte d;

    for (c = 0; c < 16; c++)         // loop through each logical colour
        if (vidpal[c] & 8) {
            if (vid_con_reg & 1) {
                switch ((vidpal[c] & 7) ^ 7) {
                    case 0:
                        d = EGA_WHITE;
                        break;
                    case 1:
                        d = EGA_CYAN;
                        break;
                    case 2:
                        d = EGA_MAGENTA;
                        break;
                    case 3:
                        d = EGA_BLUE;
                        break;
                    case 4:
                        d = EGA_YELLOW;
                        break;
                    case 5:
                        d = EGA_GREEN;
                        break;
                    case 6:
                        d = EGA_RED;
                        break;
                    case 7:
                        d = EGA_BLACK;
                        break;
                }
                setpalette(c, d);        // update pc palette
            }
            else {
                switch ((vidpal[c] & 7) ^ 7) {
                    case 0:
                        d = EGA_BLACK;
                        break;
                    case 1:
                        d = EGA_RED;
                        break;
                    case 2:
                        d = EGA_GREEN;
                        break;
                    case 3:
                        d = EGA_YELLOW;
                        break;
                    case 4:
                        d = EGA_BLUE;
                        break;
                    case 5:
                        d = EGA_MAGENTA;
                        break;
                    case 6:
                        d = EGA_CYAN;
                        break;
                    case 7:
                        d = EGA_WHITE;
                        break;
                }
                setpalette(c, d);        // update pc palette
            }

        }
}